

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void VP8LHistogramCreate(VP8LHistogram *h,VP8LBackwardRefs *refs,int palette_code_bits)

{
  int in_EDX;
  VP8LHistogram *in_RSI;
  VP8LHistogram *in_RDI;
  
  if (-1 < in_EDX) {
    in_RDI->palette_code_bits = in_EDX;
  }
  HistogramClear(in_RSI);
  VP8LHistogramStoreRefs((VP8LBackwardRefs *)h,(_func_int_int_int *)refs,palette_code_bits,in_RDI);
  return;
}

Assistant:

void VP8LHistogramCreate(VP8LHistogram* const h,
                         const VP8LBackwardRefs* const refs,
                         int palette_code_bits) {
  if (palette_code_bits >= 0) {
    h->palette_code_bits = palette_code_bits;
  }
  HistogramClear(h);
  VP8LHistogramStoreRefs(refs, /*distance_modifier=*/NULL,
                         /*distance_modifier_arg0=*/0, h);
}